

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void plutovg_path_add_rect(plutovg_path_t *path,float x,float y,float w,float h)

{
  float h_local;
  float w_local;
  float y_local;
  float x_local;
  plutovg_path_t *path_local;
  
  plutovg_path_reserve(path,0xc);
  plutovg_path_move_to(path,x,y);
  plutovg_path_line_to(path,x + w,y);
  plutovg_path_line_to(path,x + w,y + h);
  plutovg_path_line_to(path,x,y + h);
  plutovg_path_line_to(path,x,y);
  plutovg_path_close(path);
  return;
}

Assistant:

void plutovg_path_add_rect(plutovg_path_t* path, float x, float y, float w, float h)
{
    plutovg_path_reserve(path, 6 * 2);
    plutovg_path_move_to(path, x, y);
    plutovg_path_line_to(path, x + w, y);
    plutovg_path_line_to(path, x + w, y + h);
    plutovg_path_line_to(path, x, y + h);
    plutovg_path_line_to(path, x, y);
    plutovg_path_close(path);
}